

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FieldDescriptorProto * __thiscall
google::protobuf::DescriptorProto::add_field(DescriptorProto *this)

{
  FieldDescriptorProto *pFVar1;
  DescriptorProto *this_local;
  
  pFVar1 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this->field_);
  return pFVar1;
}

Assistant:

inline ::google::protobuf::FieldDescriptorProto* DescriptorProto::add_field() {
  return field_.Add();
}